

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool local_processing_only)

{
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  __last;
  byte bVar1;
  bool bVar2;
  type tVar3;
  Classifier CVar4;
  int iVar5;
  int iVar6;
  reference pvVar7;
  undefined8 uVar8;
  element_type *peVar9;
  long lVar10;
  App *pAVar11;
  undefined1 *puVar12;
  char *pcVar13;
  pointer pOVar14;
  int *piVar15;
  Option *pOVar16;
  Option *pOVar17;
  ulong uVar18;
  byte in_CL;
  char in_DL;
  App *in_RSI;
  long in_RDI;
  string res_1;
  string arg;
  size_t remreqpos;
  string current_;
  string res;
  int result_count;
  int collected;
  int tmax;
  int max_num;
  int min_num;
  Option_p *op;
  bool val;
  string dummy2;
  string dummy1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nval;
  string v;
  App *sub;
  size_type dotloc;
  string nvalue;
  string narg_name;
  shared_ptr<CLI::App> *subc;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  op_ptr;
  string rest;
  string value;
  string arg_name;
  string current;
  value_type *in_stack_fffffffffffff708;
  Option *in_stack_fffffffffffff710;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff718;
  value_type *__x;
  undefined4 in_stack_fffffffffffff720;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffff724;
  string *in_stack_fffffffffffff730;
  size_t in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  undefined4 in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff74c;
  string *in_stack_fffffffffffff750;
  pointer in_stack_fffffffffffff758;
  undefined2 uVar20;
  App *in_stack_fffffffffffff760;
  App *in_stack_fffffffffffff768;
  undefined7 in_stack_fffffffffffff770;
  undefined1 in_stack_fffffffffffff777;
  string *in_stack_fffffffffffff778;
  undefined2 uVar21;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  in_stack_fffffffffffff780;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  in_stack_fffffffffffff788;
  Option *pOVar22;
  undefined5 in_stack_fffffffffffff790;
  Classifier in_stack_fffffffffffff795;
  undefined1 in_stack_fffffffffffff796;
  undefined1 uVar23;
  undefined1 in_stack_fffffffffffff797;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  in_stack_fffffffffffff798;
  Option *in_stack_fffffffffffff7b0;
  byte local_839;
  App *in_stack_fffffffffffff7e0;
  string *in_stack_fffffffffffff7e8;
  pointer in_stack_fffffffffffff7f0;
  pointer in_stack_fffffffffffff7f8;
  int in_stack_fffffffffffff804;
  undefined4 in_stack_fffffffffffff808;
  int in_stack_fffffffffffff80c;
  undefined8 in_stack_fffffffffffff868;
  undefined1 ignore_used_subcommands;
  string *in_stack_fffffffffffff870;
  App *in_stack_fffffffffffff878;
  string *in_stack_fffffffffffff888;
  string *in_stack_fffffffffffff890;
  Option *in_stack_fffffffffffff898;
  string local_6e8 [39];
  undefined1 local_6c1;
  string local_680 [32];
  pointer local_660;
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  pointer local_5f8;
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [6];
  undefined1 in_stack_fffffffffffffa56;
  undefined1 in_stack_fffffffffffffa57;
  Option *in_stack_fffffffffffffa58;
  string local_538 [32];
  string local_518 [32];
  pointer local_4f8;
  string local_4f0 [32];
  pointer local_4d0;
  string local_4c8 [32];
  pointer local_4a8;
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [36];
  int local_43c;
  int local_438;
  int local_434;
  int local_430;
  int local_42c;
  int local_428;
  int local_424;
  string local_420 [32];
  reference local_400;
  byte local_3f1;
  string local_3f0 [32];
  string local_3d0 [16];
  App *in_stack_fffffffffffffc40;
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [39];
  allocator<char> local_349;
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  App *local_2a8;
  ulong local_2a0;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_298;
  string local_290 [32];
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_270;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_268;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_260;
  undefined1 local_252 [10];
  undefined8 local_248;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [36];
  int local_1bc;
  reference local_1b8;
  shared_ptr<CLI::App> *local_1b0;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_1a8;
  long local_1a0;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_198;
  string local_190 [40];
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_168;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_160;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_158;
  undefined1 local_14a;
  undefined1 local_122;
  undefined1 local_fa;
  undefined1 local_d1;
  value_type local_a0;
  string local_80 [32];
  string local_60 [32];
  string local_40 [30];
  undefined1 in_stack_ffffffffffffffde;
  Classifier in_stack_ffffffffffffffdf;
  undefined6 in_stack_ffffffffffffffe0;
  byte local_1;
  
  bVar1 = in_CL & 1;
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff710);
  ::std::__cxx11::string::string(local_40,(string *)pvVar7);
  ::std::__cxx11::string::string(local_60);
  ::std::__cxx11::string::string(local_80);
  ::std::__cxx11::string::string((string *)&local_a0);
  switch(in_DL) {
  case '\0':
  case '\x01':
  case '\x05':
  case '\x06':
  default:
    local_14a = 1;
    uVar8 = __cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff750,
               (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    HorribleError::HorribleError
              ((HorribleError *)in_stack_fffffffffffff780._M_current,in_stack_fffffffffffff778);
    local_14a = 0;
    __cxa_throw(uVar8,&HorribleError::typeinfo,HorribleError::~HorribleError);
  case '\x02':
    bVar2 = detail::split_short((string *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
                                (string *)
                                CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
    if (!bVar2) {
      local_fa = 1;
      uVar8 = __cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff750,
                 (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
      HorribleError::HorribleError
                ((HorribleError *)in_stack_fffffffffffff780._M_current,in_stack_fffffffffffff778);
      local_fa = 0;
      __cxa_throw(uVar8,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    break;
  case '\x03':
    bVar2 = detail::split_long(in_stack_fffffffffffff778,
                               (string *)
                               CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
                               (string *)in_stack_fffffffffffff768);
    if (!bVar2) {
      local_d1 = 1;
      uVar8 = __cxa_allocate_exception(0x38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff710);
      ::std::operator+((char *)in_stack_fffffffffffff758,in_stack_fffffffffffff750);
      HorribleError::HorribleError
                ((HorribleError *)in_stack_fffffffffffff780._M_current,in_stack_fffffffffffff778);
      local_d1 = 0;
      __cxa_throw(uVar8,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    break;
  case '\x04':
    bVar2 = detail::split_windows_style
                      (in_stack_fffffffffffff778,
                       (string *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
                       (string *)in_stack_fffffffffffff768);
    if (!bVar2) {
      local_122 = 1;
      uVar8 = __cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff750,
                 (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
      HorribleError::HorribleError
                ((HorribleError *)in_stack_fffffffffffff780._M_current,in_stack_fffffffffffff778);
      local_122 = 0;
      __cxa_throw(uVar8,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
  }
  local_160 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)in_stack_fffffffffffff708);
  local_168 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)in_stack_fffffffffffff708);
  ::std::__cxx11::string::string(local_190,local_60);
  __last._M_current._5_1_ = in_stack_fffffffffffff795;
  __last._M_current._0_5_ = in_stack_fffffffffffff790;
  __last._M_current._6_1_ = in_stack_fffffffffffff796;
  __last._M_current._7_1_ = in_stack_fffffffffffff797;
  local_158 = ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (in_stack_fffffffffffff798,__last,
                         (anon_class_40_2_a297e68f_for__M_pred *)
                         in_stack_fffffffffffff788._M_current);
  _parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)
  ::{lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#1}::~unique_ptr
            ((anon_class_40_2_a297e68f_for__M_pred *)0x157290);
  local_198 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)in_stack_fffffffffffff708);
  bVar2 = __gnu_cxx::operator==
                    ((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                      *)in_stack_fffffffffffff710,
                     (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                      *)in_stack_fffffffffffff708);
  if (bVar2) {
    local_1a0 = in_RDI + 0x2c0;
    local_1a8._M_current =
         (shared_ptr<CLI::App> *)
         std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                   ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     *)in_stack_fffffffffffff708);
    local_1b0 = (shared_ptr<CLI::App> *)
                std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ::end((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                       *)in_stack_fffffffffffff708);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                               *)in_stack_fffffffffffff710,
                              (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                               *)in_stack_fffffffffffff708), bVar2) {
      local_1b8 = __gnu_cxx::
                  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                  ::operator*(&local_1a8);
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x15734a
                );
      uVar18 = ::std::__cxx11::string::empty();
      if (((uVar18 & 1) != 0) &&
         (peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x15736c), (peVar9->disabled_ & 1U) == 0)) {
        std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x157383);
        bVar2 = _parse_arg(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)CONCAT17(in_DL,CONCAT16(bVar1,in_stack_ffffffffffffffe0)),
                           in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
        if (bVar2) {
          peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1573cc);
          if ((peVar9->pre_parse_called_ & 1U) == 0) {
            std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1573df);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RSI);
            _trigger_pre_parse((App *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                               in_stack_fffffffffffff738);
          }
          local_1 = 1;
          local_1bc = 1;
          goto LAB_0015905f;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator++(&local_1a8);
    }
    if ((((*(byte *)(in_RDI + 0x2e3) & 1) != 0) && (in_DL == '\x02')) &&
       (uVar18 = ::std::__cxx11::string::size(), 2 < uVar18)) {
      ::std::__cxx11::string::string(local_1e0);
      ::std::__cxx11::string::string(local_200);
      local_252[1] = 0x2d;
      local_252._2_8_ = local_252 + 1;
      local_248 = 1;
      in_stack_fffffffffffff890 = (string *)local_252;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(local_252 + 0x12),local_252._2_8_,local_248,in_stack_fffffffffffff890);
      ::std::operator+(in_stack_fffffffffffff718,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff710);
      detail::split_long(in_stack_fffffffffffff778,
                         (string *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
                         (string *)in_stack_fffffffffffff768);
      ::std::__cxx11::string::~string(local_220);
      ::std::__cxx11::string::~string((string *)(local_252 + 0x12));
      ::std::allocator<char>::~allocator((allocator<char> *)local_252);
      in_stack_fffffffffffff888 = (string *)(in_RDI + 0xd8);
      local_268 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  ::std::
                  begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                            ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                              *)in_stack_fffffffffffff708);
      local_270 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  ::std::
                  end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                            ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                              *)in_stack_fffffffffffff708);
      ::std::__cxx11::string::string(local_290,local_1e0);
      local_260 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  ::std::
                  find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                            (in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                             (anon_class_32_1_6b09f7e2_for__M_pred *)in_stack_fffffffffffff778);
      local_158 = (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                   )local_260;
      _parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)
      ::{lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#2}::~unique_ptr
                ((anon_class_32_1_6b09f7e2_for__M_pred *)0x157619);
      local_298 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  ::std::
                  end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                            ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                              *)in_stack_fffffffffffff708);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                          *)in_stack_fffffffffffff710,
                         (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                          *)in_stack_fffffffffffff708);
      if (bVar2) {
        ::std::__cxx11::string::operator=(local_60,local_1e0);
        ::std::__cxx11::string::operator=(local_80,local_200);
        ::std::__cxx11::string::clear();
        local_1bc = 4;
      }
      else {
        local_1bc = 0;
      }
      ::std::__cxx11::string::~string(local_200);
      ::std::__cxx11::string::~string(local_1e0);
      if (local_1bc != 0) goto LAB_00157f65;
    }
    uVar20 = (undefined2)((ulong)in_stack_fffffffffffff758 >> 0x30);
    if ((*(long *)(in_RDI + 0x308) != 0) &&
       (uVar18 = ::std::__cxx11::string::empty(), (uVar18 & 1) != 0)) {
      local_1 = 0;
      local_1bc = 1;
      goto LAB_0015905f;
    }
    uVar18 = ::std::__cxx11::string::find_first_of((char)local_60,0x2e);
    local_2a0 = uVar18;
    if ((uVar18 != 0xffffffffffffffff) &&
       (lVar10 = ::std::__cxx11::string::size(), uVar18 < lVar10 - 1U)) {
      ::std::__cxx11::string::substr((ulong)local_2c8,(ulong)local_60);
      pAVar11 = _find_subcommand(in_stack_fffffffffffff768,(string *)in_stack_fffffffffffff760,
                                 SUB21((ushort)uVar20 >> 8,0),SUB21(uVar20,0));
      ::std::__cxx11::string::~string(local_2c8);
      local_2a8 = pAVar11;
      if (pAVar11 != (App *)0x0) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff710);
        ::std::__cxx11::string::string(local_2e8,(string *)pvVar7);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1578db);
        ::std::__cxx11::string::substr((ulong)local_308,(ulong)local_60);
        ::std::__cxx11::string::operator=(local_60,local_308);
        ::std::__cxx11::string::~string(local_308);
        uVar18 = ::std::__cxx11::string::size();
        if (uVar18 < 2) {
          ::std::__cxx11::string::substr((ulong)local_390,(ulong)local_2e8);
          puVar12 = (undefined1 *)::std::__cxx11::string::front();
          *puVar12 = 0x2d;
          uVar18 = ::std::__cxx11::string::size();
          if (2 < uVar18) {
            ::std::__cxx11::string::substr((ulong)local_3b0,(ulong)local_390);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
            ::std::__cxx11::string::~string(local_3b0);
            ::std::__cxx11::string::resize((ulong)local_390);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                      in_stack_fffffffffffff718);
          in_DL = '\x02';
          ::std::__cxx11::string::~string(local_390);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff750,
                     (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
          ::std::__cxx11::string::substr((ulong)local_370,(ulong)local_2e8);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
          ::std::__cxx11::string::~string(local_328);
          ::std::__cxx11::string::~string(local_370);
          ::std::__cxx11::string::~string(local_348);
          ::std::allocator<char>::~allocator(&local_349);
          in_DL = '\x03';
        }
        ::std::__cxx11::string::string(local_3d0);
        ::std::__cxx11::string::string(local_3f0);
        local_3f1 = 0;
        if (in_DL == '\x02') {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff710);
          pcVar13 = (char *)::std::__cxx11::string::operator[]((ulong)pvVar7);
          bVar2 = detail::valid_first_char<char>(*pcVar13);
          if (!bVar2) goto LAB_00157c64;
LAB_00157c9f:
          uVar21 = (undefined2)((ulong)in_stack_fffffffffffff778 >> 0x30);
          local_3f1 = _parse_arg(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)CONCAT17(in_DL,CONCAT16(bVar1,in_stack_ffffffffffffffe0))
                                 ,in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
        }
        else {
LAB_00157c64:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff710);
          bVar2 = detail::split_long(in_stack_fffffffffffff778,
                                     (string *)
                                     CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
                                     (string *)in_stack_fffffffffffff768);
          uVar21 = (undefined2)((ulong)in_stack_fffffffffffff778 >> 0x30);
          if (bVar2) goto LAB_00157c9f;
        }
        if ((local_3f1 & 1) == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x157e0d);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                      in_stack_fffffffffffff718);
          local_1bc = 0;
        }
        else {
          if ((local_2a8->silent_ & 1U) == 0) {
            std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                      ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)
                       CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                       (value_type *)in_stack_fffffffffffff718);
          }
          increment_parsed((App *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RSI);
          _trigger_pre_parse((App *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                             in_stack_fffffffffffff738);
          bVar2 = ::std::function::operator_cast_to_bool
                            ((function<void_()> *)in_stack_fffffffffffff710);
          if (bVar2) {
            _process_env(in_stack_fffffffffffff7e0);
            _process_callbacks((App *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770))
            ;
            _process_help_flags(in_stack_fffffffffffff760,SUB21((ushort)uVar20 >> 8,0),
                                SUB21(uVar20,0));
            _process_requirements(in_stack_fffffffffffffc40);
            run_callback((App *)in_stack_fffffffffffff780._M_current,SUB21((ushort)uVar21 >> 8,0),
                         SUB21(uVar21,0));
          }
          local_1 = 1;
          local_1bc = 1;
        }
        ::std::__cxx11::string::~string(local_3f0);
        ::std::__cxx11::string::~string(local_3d0);
        ::std::__cxx11::string::~string(local_2e8);
        if (local_1bc != 0) goto LAB_0015905f;
      }
    }
    CVar4 = (Classifier)(in_stack_fffffffffffff738 >> 0x38);
    if ((bVar1 & 1) == 0) {
      if ((*(long *)(in_RDI + 0x308) == 0) || ((*(byte *)(in_RDI + 0x2da) & 1) == 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x157f2e);
        _move_to_missing((App *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),CVar4,
                         in_stack_fffffffffffff730);
        local_1 = 1;
        local_1bc = 1;
      }
      else {
        _get_fallthrough_parent(in_stack_fffffffffffff760);
        local_1 = _parse_arg(in_RSI,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)CONCAT17(in_DL,CONCAT16(bVar1,in_stack_ffffffffffffffe0)),
                             in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
        local_1bc = 1;
      }
    }
    else {
      local_1 = 0;
      local_1bc = 1;
    }
    goto LAB_0015905f;
  }
LAB_00157f65:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x157f72);
  local_400 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
              ::operator*(&local_158);
  pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x157f94);
  bVar2 = Option::get_inject_separator(pOVar14);
  if (bVar2) {
    pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x157fc2);
    Option::results_abi_cxx11_(pOVar14);
    bVar2 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
    if (!bVar2) {
      pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x157fe7);
      Option::results_abi_cxx11_(pOVar14);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff710);
      uVar18 = ::std::__cxx11::string::empty();
      if ((uVar18 & 1) == 0) {
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158010);
        ::std::__cxx11::string::string(local_420);
        Option::add_result(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
        ::std::__cxx11::string::~string(local_420);
      }
    }
  }
  pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158088);
  bVar2 = Option::get_trigger_on_parse(pOVar14);
  if ((bVar2) &&
     (pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1580b3),
     pOVar14->current_option_state_ == callback_run)) {
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1580c9);
    Option::clear(in_stack_fffffffffffff710);
  }
  pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1580de);
  local_428 = Option::get_type_size_min(pOVar14);
  pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x15810a);
  local_42c = Option::get_items_expected_min(pOVar14);
  piVar15 = std::min<int>(&local_428,&local_42c);
  local_424 = *piVar15;
  std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158156);
  local_430 = Option::get_items_expected_max(in_stack_fffffffffffff710);
  if (0x1ffffff < local_430) {
    pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158193);
    bVar2 = Option::get_allow_extra_args(pOVar14);
    if (!bVar2) {
      pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1581c2);
      in_stack_fffffffffffff80c = Option::get_type_size_max(pOVar14);
      local_434 = in_stack_fffffffffffff80c;
      pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1581ee);
      Option::get_expected_min(pOVar14);
      tVar3 = detail::checked_multiply<int>
                        ((int *)in_stack_fffffffffffff718,
                         (int)((ulong)in_stack_fffffffffffff710 >> 0x20));
      in_stack_fffffffffffff808 = CONCAT13(tVar3,(int3)in_stack_fffffffffffff808);
      in_stack_fffffffffffff804 = local_434;
      local_430 = local_434;
      if (!tVar3) {
        local_430 = 0x20000000;
        in_stack_fffffffffffff804 = local_430;
      }
    }
  }
  local_438 = 0;
  local_43c = 0;
  if (local_430 == 0) {
    in_stack_fffffffffffff7f8 =
         std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                   ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158278);
    ::std::__cxx11::string::string(local_480,local_80);
    Option::get_flag_value
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    ::std::__cxx11::string::~string(local_480);
    in_stack_fffffffffffff7f0 =
         std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                   ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1582d8);
    ::std::__cxx11::string::string(local_4a0,local_460);
    Option::add_result(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
    ::std::__cxx11::string::~string(local_4a0);
    in_stack_fffffffffffff7e8 = (string *)(in_RDI + 0x1d0);
    local_4a8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                           in_stack_fffffffffffff710);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff710,
               (value_type *)in_stack_fffffffffffff708);
    ::std::__cxx11::string::~string(local_460);
  }
  else {
    uVar18 = ::std::__cxx11::string::empty();
    if ((uVar18 & 1) == 0) {
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158400);
      ::std::__cxx11::string::string(local_4c8,local_80);
      Option::add_result((Option *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         in_stack_fffffffffffff718,(int *)in_stack_fffffffffffff710);
      ::std::__cxx11::string::~string(local_4c8);
      local_4d0 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                             in_stack_fffffffffffff710);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff710,
                 (value_type *)in_stack_fffffffffffff708);
      local_438 = local_43c + local_438;
    }
    else {
      uVar18 = ::std::__cxx11::string::empty();
      if ((uVar18 & 1) == 0) {
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1584ef);
        ::std::__cxx11::string::string(local_4f0,(string *)&local_a0);
        Option::add_result((Option *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                           in_stack_fffffffffffff718,(int *)in_stack_fffffffffffff710);
        ::std::__cxx11::string::~string(local_4f0);
        local_4f8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                               in_stack_fffffffffffff710);
        std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                  ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)
                   in_stack_fffffffffffff710,(value_type *)in_stack_fffffffffffff708);
        ::std::__cxx11::string::operator=((string *)&local_a0,"");
        local_438 = local_43c + local_438;
      }
    }
  }
  while( true ) {
    local_839 = 0;
    if (local_438 < local_424) {
      bVar2 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
      local_839 = bVar2 ^ 0xff;
    }
    iVar6 = (int)((ulong)in_stack_fffffffffffff7f0 >> 0x20);
    uVar23 = (undefined1)(in_stack_fffffffffffff738 >> 0x38);
    if ((local_839 & 1) == 0) break;
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff710);
    ::std::__cxx11::string::string(local_518,(string *)pvVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x158640);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x15864d);
    ::std::__cxx11::string::string(local_538,local_518);
    Option::add_result((Option *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                       in_stack_fffffffffffff718,(int *)in_stack_fffffffffffff710);
    ::std::__cxx11::string::~string(local_538);
    in_stack_fffffffffffff7b0 = (Option *)(in_RDI + 0x1d0);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
               in_stack_fffffffffffff710);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff710,
               (value_type *)in_stack_fffffffffffff708);
    local_438 = local_43c + local_438;
    ::std::__cxx11::string::~string(local_518);
  }
  if (local_438 < local_424) {
    uVar8 = __cxa_allocate_exception(0x38);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158785);
    Option::get_name_abi_cxx11_
              (in_stack_fffffffffffffa58,(bool)in_stack_fffffffffffffa57,
               (bool)in_stack_fffffffffffffa56);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1587b6);
    Option::get_type_name_abi_cxx11_((Option *)in_stack_fffffffffffff798._M_current);
    ArgumentMismatch::TypedAtLeast
              ((string *)in_stack_fffffffffffff7f8,iVar6,in_stack_fffffffffffff7e8);
    __cxa_throw(uVar8,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
  }
  if (local_438 < local_430) {
LAB_001588cc:
    pOVar16 = (Option *)
              _count_remaining_positionals
                        ((App *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                         (bool)uVar23);
    in_stack_fffffffffffff798._M_current =
         (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)pOVar16;
    do {
      if (local_438 < local_430) {
LAB_0015893d:
        bVar2 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
        uVar23 = false;
        if (!bVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff710);
          in_stack_fffffffffffff795 =
               _recognize(in_stack_fffffffffffff878,in_stack_fffffffffffff870,
                          SUB81((ulong)in_stack_fffffffffffff868 >> 0x38,0));
          uVar23 = in_stack_fffffffffffff795 == NONE;
        }
      }
      else {
        pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158915)
        ;
        in_stack_fffffffffffff797 = Option::get_allow_extra_args(pOVar14);
        uVar23 = false;
        if ((bool)in_stack_fffffffffffff797) goto LAB_0015893d;
      }
      ignore_used_subcommands = (undefined1)((ulong)in_stack_fffffffffffff868 >> 0x38);
      if ((bool)uVar23 == false) goto LAB_00158ba9;
      pOVar22 = pOVar16;
      pOVar17 = (Option *)
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_RSI);
      ignore_used_subcommands = (undefined1)((ulong)in_stack_fffffffffffff868 >> 0x38);
      if (pOVar17 <= pOVar22) goto LAB_00158ba9;
      if ((*(byte *)(in_RDI + 0x2e1) & 1) != 0) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff710);
        iVar6 = (int)((ulong)pOVar22 >> 0x20);
        ::std::__cxx11::string::string(local_5b0,(string *)pvVar7);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158a18);
        Option::_validate((Option *)in_stack_fffffffffffff798._M_current,
                          (string *)
                          CONCAT17(in_stack_fffffffffffff797,
                                   CONCAT16(uVar23,CONCAT15(in_stack_fffffffffffff795,
                                                            in_stack_fffffffffffff790))),iVar6);
        ::std::__cxx11::string::operator=(local_5b0,local_5d0);
        ::std::__cxx11::string::~string(local_5d0);
        uVar18 = ::std::__cxx11::string::empty();
        if ((uVar18 & 1) == 0) {
          local_1bc = 10;
        }
        else {
          local_1bc = 0;
        }
        ::std::__cxx11::string::~string(local_5b0);
        ignore_used_subcommands = (undefined1)((ulong)in_stack_fffffffffffff868 >> 0x38);
        if (local_1bc != 0) goto LAB_00158ba9;
      }
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158ad3);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff710);
      ::std::__cxx11::string::string(local_5f0,(string *)pvVar7);
      Option::add_result((Option *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                         in_stack_fffffffffffff718,(int *)in_stack_fffffffffffff710);
      ::std::__cxx11::string::~string(local_5f0);
      local_5f8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                             in_stack_fffffffffffff710);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff710,
                 (value_type *)in_stack_fffffffffffff708);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x158b69);
      local_438 = local_43c + local_438;
    } while( true );
  }
  pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1588ab);
  bVar2 = Option::get_allow_extra_args(pOVar14);
  if (bVar2) goto LAB_001588cc;
LAB_00158d79:
  if (0 < local_424) {
    iVar6 = local_438;
    pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158d9f);
    iVar5 = Option::get_type_size_max(pOVar14);
    if (iVar6 % iVar5 != 0) {
      pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158dce);
      iVar6 = Option::get_type_size_max(pOVar14);
      pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158de9);
      iVar5 = Option::get_type_size_min(pOVar14);
      if (iVar6 == iVar5) {
        local_6c1 = 1;
        uVar8 = __cxa_allocate_exception(0x38);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158e94);
        Option::get_name_abi_cxx11_
                  (in_stack_fffffffffffffa58,(bool)in_stack_fffffffffffffa57,
                   (bool)in_stack_fffffffffffffa56);
        pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158eb7)
        ;
        Option::get_type_size_min(pOVar14);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158ed2);
        Option::get_type_name_abi_cxx11_((Option *)in_stack_fffffffffffff798._M_current);
        ArgumentMismatch::PartialType
                  ((string *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                   in_stack_fffffffffffff804,(string *)in_stack_fffffffffffff7f8);
        local_6c1 = 0;
        __cxa_throw(uVar8,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
      }
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158e10);
      ::std::__cxx11::string::string(local_680);
      Option::add_result(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
      ::std::__cxx11::string::~string(local_680);
    }
  }
  pOVar14 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158fad);
  bVar2 = Option::get_trigger_on_parse(pOVar14);
  uVar19 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff720);
  if (bVar2) {
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158fd2);
    Option::run_callback(in_stack_fffffffffffff7b0);
  }
  uVar18 = ::std::__cxx11::string::empty();
  if ((uVar18 & 1) == 0) {
    ::std::operator+((char *)in_stack_fffffffffffff758,in_stack_fffffffffffff750);
    __x = &local_a0;
    this_00 = local_6e8;
    ::std::__cxx11::string::operator=((string *)__x,this_00);
    ::std::__cxx11::string::~string(this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff724,uVar19),__x);
  }
  local_1 = 1;
  local_1bc = 1;
LAB_0015905f:
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::~string(local_40);
  return (bool)(local_1 & 1);
LAB_00158ba9:
  bVar2 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
  if (!bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff710);
    CVar4 = _recognize(in_stack_fffffffffffff878,in_stack_fffffffffffff870,
                       (bool)ignore_used_subcommands);
    if (CVar4 == POSITIONAL_MARK) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x158bf7);
    }
  }
  if (((local_424 == 0) && (0 < local_430)) && (local_438 == 0)) {
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158c2e);
    ::std::__cxx11::string::string(local_638);
    Option::get_flag_value
              (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    ::std::__cxx11::string::~string(local_638);
    in_stack_fffffffffffff758 =
         std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                   ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x158c80);
    ::std::__cxx11::string::string(local_658,local_618);
    Option::add_result(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
    ::std::__cxx11::string::~string(local_658);
    in_stack_fffffffffffff750 = (string *)(in_RDI + 0x1d0);
    local_660 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                           in_stack_fffffffffffff710);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff710,
               (value_type *)in_stack_fffffffffffff708);
    ::std::__cxx11::string::~string(local_618);
  }
  goto LAB_00158d79;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    while(op_ptr == std::end(options_)) {
        // using while so we can break
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        if(allow_non_standard_options_ && current_type == detail::Classifier::SHORT && current.size() > 2) {
            std::string narg_name;
            std::string nvalue;
            detail::split_long(std::string{'-'} + current, narg_name, nvalue);
            op_ptr = std::find_if(std::begin(options_), std::end(options_), [narg_name](const Option_p &opt) {
                return opt->check_sname(narg_name);
            });
            if(op_ptr != std::end(options_)) {
                arg_name = narg_name;
                value = nvalue;
                rest.clear();
                break;
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos && dotloc < arg_name.size() - 1) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                std::string dummy1, dummy2;
                bool val = false;
                if((current_type == detail::Classifier::SHORT && detail::valid_first_char(args.back()[1])) ||
                   detail::split_long(args.back(), dummy1, dummy2)) {
                    val = sub->_parse_arg(args, current_type, true);
                }

                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}